

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O2

TestLog * glu::operator<<(TestLog *log,Shader *shader)

{
  size_t in_RCX;
  void *__buf;
  allocator<char> local_69;
  string local_68 [32];
  undefined1 local_48 [40];
  
  std::__cxx11::string::string<std::allocator<char>>(local_68,"Plain shader",&local_69);
  local_48[0] = false;
  std::__cxx11::string::string((string *)(local_48 + 8),local_68);
  tcu::LogShaderProgram::write((LogShaderProgram *)local_48,(int)log,__buf,in_RCX);
  operator<<(log,&shader->m_info);
  tcu::TestLog::endShaderProgram(log);
  std::__cxx11::string::~string((string *)(local_48 + 8));
  std::__cxx11::string::~string(local_68);
  return log;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const Shader& shader)
{
	return log << tcu::TestLog::ShaderProgram(false, "Plain shader") << shader.getInfo() << tcu::TestLog::EndShaderProgram;
}